

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::Viterbi
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *status)

{
  HMMModel *pHVar1;
  long lVar2;
  ulong __new_size;
  const_reference ppuVar3;
  reference pvVar4;
  reference pvVar5;
  size_type __n;
  double *pdVar6;
  double dVar7;
  double dVar8;
  int local_ec;
  ulong uStack_e8;
  int x_1;
  size_t preY;
  size_t y_1;
  size_t x;
  double emitProb;
  size_t y;
  undefined1 local_b8 [8];
  vector<double,_std::allocator<double>_> weight;
  allocator<int> local_89;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> path;
  double endS;
  double endE;
  double tmp;
  size_t stat;
  size_t old;
  size_t now;
  size_t XYSize;
  size_t X;
  size_t Y;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *status_local;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  
  lVar2 = (long)end - (long)begin >> 2;
  __new_size = lVar2 * -0x3333333333333333;
  std::allocator<int>::allocator(&local_89);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,lVar2 * 0x3333333333333334,&local_89);
  std::allocator<int>::~allocator(&local_89);
  std::allocator<double>::allocator((allocator<double> *)((long)&y + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b8,lVar2 * 0x3333333333333334,
             (allocator<double> *)((long)&y + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&y + 7));
  for (emitProb = 0.0; (ulong)emitProb < 4; emitProb = (double)((long)emitProb + 1)) {
    pHVar1 = this->model_;
    dVar8 = pHVar1->startProb[(long)emitProb];
    ppuVar3 = std::
              vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
              ::operator[](&pHVar1->emitProbVec,(size_type)emitProb);
    dVar7 = HMMModel::GetEmitProb(pHVar1,*ppuVar3,begin->rune,-3.14e+100);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_b8,
                        (long)emitProb * __new_size);
    *pvVar4 = dVar8 + dVar7;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_88,(long)emitProb * __new_size);
    *pvVar5 = -1;
  }
  for (y_1 = 1; y_1 < __new_size; y_1 = y_1 + 1) {
    for (preY = 0; preY < 4; preY = preY + 1) {
      __n = y_1 + preY * __new_size;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_b8,__n);
      *pvVar4 = -3.14e+100;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,__n);
      *pvVar5 = 1;
      pHVar1 = this->model_;
      ppuVar3 = std::
                vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                ::operator[](&pHVar1->emitProbVec,preY);
      dVar8 = HMMModel::GetEmitProb(pHVar1,*ppuVar3,begin[y_1].rune,-3.14e+100);
      for (uStack_e8 = 0; uStack_e8 < 4; uStack_e8 = uStack_e8 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_b8,
                            (y_1 - 1) + uStack_e8 * __new_size);
        dVar7 = *pvVar4 + this->model_->transProb[uStack_e8][preY] + dVar8;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_b8,__n);
        if (*pvVar4 <= dVar7 && dVar7 != *pvVar4) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_b8,__n);
          *pvVar4 = dVar7;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_88,__n);
          *pvVar5 = (value_type)uStack_e8;
        }
      }
    }
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_b8,
                      lVar2 * -0x6666666666666666 - 1);
  dVar8 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_b8,
                      lVar2 * 0x3333333333333334 - 1);
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)*pvVar4;
  if (dVar8 < (double)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
    tmp = 1.48219693752374e-323;
  }
  else {
    tmp = 4.94065645841247e-324;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(status,__new_size);
  local_ec = (int)__new_size;
  while (local_ec = local_ec + -1, -1 < local_ec) {
    pdVar6 = (double *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (status,(long)local_ec);
    *pdVar6 = tmp;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_88,
                        (long)local_ec + (long)tmp * __new_size);
    tmp = (double)(long)*pvVar5;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_b8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  return;
}

Assistant:

void Viterbi(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<size_t>& status) const {
    size_t Y = HMMModel::STATUS_SUM;
    size_t X = end - begin;

    size_t XYSize = X * Y;
    size_t now, old, stat;
    double tmp, endE, endS;

    vector<int> path(XYSize);
    vector<double> weight(XYSize);

    //start
    for (size_t y = 0; y < Y; y++) {
      weight[0 + y * X] = model_->startProb[y] + model_->GetEmitProb(model_->emitProbVec[y], begin->rune, MIN_DOUBLE);
      path[0 + y * X] = -1;
    }

    double emitProb;

    for (size_t x = 1; x < X; x++) {
      for (size_t y = 0; y < Y; y++) {
        now = x + y*X;
        weight[now] = MIN_DOUBLE;
        path[now] = HMMModel::E; // warning
        emitProb = model_->GetEmitProb(model_->emitProbVec[y], (begin+x)->rune, MIN_DOUBLE);
        for (size_t preY = 0; preY < Y; preY++) {
          old = x - 1 + preY * X;
          tmp = weight[old] + model_->transProb[preY][y] + emitProb;
          if (tmp > weight[now]) {
            weight[now] = tmp;
            path[now] = preY;
          }
        }
      }
    }

    endE = weight[X-1+HMMModel::E*X];
    endS = weight[X-1+HMMModel::S*X];
    stat = 0;
    if (endE >= endS) {
      stat = HMMModel::E;
    } else {
      stat = HMMModel::S;
    }

    status.resize(X);
    for (int x = X -1 ; x >= 0; x--) {
      status[x] = stat;
      stat = path[x + stat*X];
    }
  }